

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O3

void Saig_BmcInterval(Saig_Bmc_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  uint uVar4;
  Aig_Obj_t *pAVar5;
  void **ppvVar6;
  Vec_Int_t *pVVar7;
  int iVar8;
  Aig_Man_t *pAVar9;
  long lVar10;
  
  iVar1 = p->pFrm->vObjs->nSize;
  iVar2 = p->pFrm->nDeleted;
  p->vTargets->nSize = 0;
  iVar8 = p->iFrameLast;
  p->iFramePrev = iVar8;
  if (iVar8 < p->nFramesMax) {
    uVar4 = p->iOutputLast;
    pAVar9 = p->pAig;
    do {
      if (uVar4 != 0) goto LAB_0050f811;
      Saig_BmcObjSetFrame(p,pAVar9->pConst1,iVar8,p->pFrm->pConst1);
      uVar4 = p->iOutputLast;
      while( true ) {
        pAVar9 = p->pAig;
LAB_0050f811:
        if (pAVar9->nTruePos <= (int)uVar4) break;
        if (p->nNodesMax + (iVar1 - iVar2) <= p->pFrm->vObjs->nSize - p->pFrm->nDeleted) {
          return;
        }
        pVVar7 = p->vVisited;
        pVVar7->nSize = 0;
        if (((int)uVar4 < 0) || (pAVar9->vCos->nSize <= (int)uVar4)) {
LAB_0050f98b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar5 = Saig_BmcIntervalConstruct_rec
                           (p,(Aig_Obj_t *)pAVar9->vCos->pArray[uVar4],p->iFrameLast,pVVar7);
        pVVar3 = p->vTargets;
        uVar4 = pVVar3->nSize;
        if (uVar4 == pVVar3->nCap) {
          if ((int)uVar4 < 0x10) {
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar3->pArray,0x80);
            }
            pVVar3->pArray = ppvVar6;
            pVVar3->nCap = 0x10;
          }
          else {
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar4 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar3->pArray,(ulong)uVar4 << 4);
            }
            pVVar3->pArray = ppvVar6;
            pVVar3->nCap = uVar4 * 2;
          }
        }
        else {
          ppvVar6 = pVVar3->pArray;
        }
        iVar8 = pVVar3->nSize;
        pVVar3->nSize = iVar8 + 1;
        ppvVar6[iVar8] = pAVar5;
        Aig_ObjCreateCo(p->pFrm,pAVar5);
        Aig_ManCleanup(p->pFrm);
        pVVar7 = p->vVisited;
        if (1 < pVVar7->nSize) {
          lVar10 = 1;
          do {
            pVVar3 = p->pAig->vObjs;
            if (pVVar3 == (Vec_Ptr_t *)0x0) {
              pAVar5 = (Aig_Obj_t *)0x0;
            }
            else {
              uVar4 = pVVar7->pArray[lVar10 + -1];
              if (((int)uVar4 < 0) || (pVVar3->nSize <= (int)uVar4)) goto LAB_0050f98b;
              pAVar5 = (Aig_Obj_t *)pVVar3->pArray[uVar4];
            }
            Saig_BmcObjFrame(p,pAVar5,pVVar7->pArray[lVar10]);
            pVVar7 = p->vVisited;
            lVar10 = lVar10 + 2;
          } while ((int)lVar10 < pVVar7->nSize);
        }
        uVar4 = p->iOutputLast + 1;
        p->iOutputLast = uVar4;
      }
      iVar8 = p->iFrameLast + 1;
      p->iFrameLast = iVar8;
      p->iOutputLast = 0;
      uVar4 = 0;
    } while (iVar8 < p->nFramesMax);
  }
  return;
}

Assistant:

void Saig_BmcInterval( Saig_Bmc_t * p )
{
    Aig_Obj_t * pTarget;
    int i, iObj, iFrame;
    int nNodes = Aig_ManObjNum( p->pFrm );
    Vec_PtrClear( p->vTargets );
    p->iFramePrev = p->iFrameLast;
    for ( ; p->iFrameLast < p->nFramesMax; p->iFrameLast++, p->iOutputLast = 0 )
    { 
        if ( p->iOutputLast == 0 )
        {
            Saig_BmcObjSetFrame( p, Aig_ManConst1(p->pAig), p->iFrameLast, Aig_ManConst1(p->pFrm) );
        }
        for ( ; p->iOutputLast < Saig_ManPoNum(p->pAig); p->iOutputLast++ )
        {
            if ( Aig_ManObjNum(p->pFrm) >= nNodes + p->nNodesMax )
                return;
//            Saig_BmcIntervalExplore_rec( p, Aig_ManCo(p->pAig, p->iOutputLast), p->iFrameLast );
            Vec_IntClear( p->vVisited );
            pTarget = Saig_BmcIntervalConstruct_rec( p, Aig_ManCo(p->pAig, p->iOutputLast), p->iFrameLast, p->vVisited );
            Vec_PtrPush( p->vTargets, pTarget );
            Aig_ObjCreateCo( p->pFrm, pTarget );
            Aig_ManCleanup( p->pFrm ); // it is not efficient to cleanup the whole manager!!!
            // check if the node is gone
            Vec_IntForEachEntryDouble( p->vVisited, iObj, iFrame, i )
                Saig_BmcObjFrame( p, Aig_ManObj(p->pAig, iObj), iFrame );
            // it is not efficient to remove nodes, which may be used later!!!
        }
    }
}